

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O3

void print_function_name(Section *sec,unsigned_long offs)

{
  Symbol *pSVar1;
  Symbol *pSVar2;
  Symbol *pSVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  pSVar3 = (Symbol *)0x0;
  do {
    uVar4 = (uint)uVar5;
    for (pSVar1 = sec->obj->objsyms[uVar5]; pSVar1 != (Symbol *)0x0; pSVar1 = pSVar1->obj_chain) {
      pSVar2 = pSVar3;
      if ((((pSVar1->relsect == sec) && (pSVar1->info < 3)) && (pSVar1->type == '\x02')) &&
         (uVar5 = pSVar1->value, uVar5 <= offs)) {
        if ((ulong)pSVar1->size == 0) {
          pSVar2 = pSVar1;
          if (((pSVar3 != (Symbol *)0x0) && (pSVar2 = pSVar3, pSVar3->value < (long)uVar5)) &&
             ((pSVar3->bind < 2 || (1 < pSVar1->bind)))) {
            pSVar2 = pSVar1;
          }
        }
        else {
          pSVar3 = pSVar1;
          if (offs < uVar5 + pSVar1->size) goto LAB_0010b55c;
        }
      }
      pSVar3 = pSVar2;
    }
    uVar5 = (ulong)(uVar4 + 1);
  } while (uVar4 < 0x1f);
LAB_0010b55c:
  if ((pSVar3 != (Symbol *)0x0) && (pSVar3 != print_function_name::last_func)) {
    print_function_name_cold_1();
  }
  return;
}

Assistant:

void print_function_name(struct Section *sec,unsigned long offs)
/* Try to determine the function to which the section offset */
/* belongs, by comparing with SYMI_FUNC-type symbol definitions. */
/* If this was successful and the current function is different */
/* from the last one printed, make an output to stderr. */
{
  static const char *infoname[] = { "", "object ", "function " };
  static struct Symbol *last_func=NULL;
  struct Symbol *sym,*func=NULL;
  int i;

  for (i=0; i<OBJSYMHTABSIZE; i++) {  /* scan all hash chains */
    for (sym=sec->obj->objsyms[i]; sym; sym=sym->obj_chain) {
      if (sym->relsect == sec) {
        if (sym->info <= SYMI_FUNC) {
          if (sym->type == SYM_RELOC) {
            if ((unsigned long)sym->value <= offs) {
              if (sym->size) {  /* size of function specified? */
                if ((unsigned long)(sym->value+sym->size) > offs) {
                  func = sym;
                  i = OBJSYMHTABSIZE;
                  break;  /* function found! */
                }
              }
              else {  /* no size - find nearest... */
                if (func) {
                  if (sym->value > func->value) {
                    if (func->bind<SYMB_GLOBAL || sym->bind>=SYMB_GLOBAL)
                      func = sym;
                  }
                }
                else
                  func = sym;
              }
            }
          }
        }
      }
    }
  }

  /* print function name */
  if (func && func!=last_func) {
    last_func = func;
    fprintf(stderr,"%s: In %s\"%s\":\n",getobjname(sec->obj),
            infoname[func->info],func->name);
  }
}